

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_ConstructFromMemory_Test::TestBody
          (ktxTexture1_CreateTest_ConstructFromMemory_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffe08) [37];
  ktxTexture1 *in_stack_fffffffffffffe10;
  ktxTexture1TestBase *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int line;
  char *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Type type;
  AssertHelper *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  char *in_stack_fffffffffffffe80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult local_158 [2];
  undefined4 local_134;
  AssertionResult local_130 [2];
  undefined1 local_109;
  AssertionResult local_108 [2];
  undefined1 local_e1;
  AssertionResult local_e0 [2];
  undefined1 local_ba;
  undefined1 local_b9;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  undefined8 local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  undefined4 local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_10[0] = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture1_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_2c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (ktx_error_code_e *)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->classId);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
      testing::AssertionResult::failure_message((AssertionResult *)0x12f029);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
      testing::Message::~Message((Message *)0x12f086);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f0f4);
    local_61 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
               (type *)0x12f122);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_78 = ktxErrorString(local_14);
      in_stack_fffffffffffffe40 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe10,(char **)in_stack_fffffffffffffe08);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe88._M_head_impl,in_stack_fffffffffffffe80
                 ,(char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_a0);
      testing::Message::~Message((Message *)0x12f246);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f2f3);
    if (local_a4 == 0) {
      local_b9 = ktxTexture1TestBase::compareTexture
                           (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      local_ba = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool *)in_stack_fffffffffffffe18,(bool *)in_stack_fffffffffffffe10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x12f399);
        type = (Type)((ulong)pcVar2 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x12f3f6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f464);
      local_e1 = 0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool *)in_stack_fffffffffffffe18,(bool *)in_stack_fffffffffffffe10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe30 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12f4e1);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x12f53e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f5ac);
      local_109 = 0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool *)in_stack_fffffffffffffe18,(bool *)in_stack_fffffffffffffe10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe28 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12f629);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x12f686);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f6f4);
      local_134 = 2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (uint *)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe20 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12f774);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x12f7d1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f83f);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (uint *)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe18 =
             (ktxTexture1TestBase *)
             testing::AssertionResult::failure_message((AssertionResult *)0x12f8bf);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x12f91c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f98a);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool *)in_stack_fffffffffffffe18,(bool *)in_stack_fffffffffffffe10);
      line = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x12f9f5);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,line,
                   in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x12fa43);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12faa5);
      if (local_10[0] != 0) {
        ktxTexture1_Destroy(local_10[0]);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, ConstructFromMemory) {
    ktxTexture1* texture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture1_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0, &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        EXPECT_EQ(compareTexture(texture), true);
        EXPECT_EQ(texture->isCompressed, KTX_FALSE);
        EXPECT_EQ(texture->generateMipmaps, KTX_FALSE);
        EXPECT_EQ(texture->numDimensions, 2U);
        EXPECT_EQ(texture->numLayers, 1U);
        EXPECT_EQ(texture->isArray, KTX_FALSE);
        if (texture)
            ktxTexture1_Destroy(texture);
    }
}